

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
pbrt::BasicSceneBuilder::Shape
          (BasicSceneBuilder *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  FileLoc loc_00;
  FileLoc loc_01;
  FileLoc loc_02;
  bool bVar1;
  ulong uVar2;
  AnimatedShapeSceneEntity *shape;
  long in_RDI;
  value_type *in_stack_00000008;
  AnimatedShapeSceneEntity *in_stack_00000010;
  ShapeSceneEntity entity_1;
  Transform *objectFromRender;
  Transform *renderFromObject;
  AnimatedShapeSceneEntity entity;
  Transform *identity;
  AnimatedTransform renderFromShape;
  int areaLightIndex;
  ParameterDictionary dict;
  Transform *in_stack_ffffffffffffef18;
  InternCache<pbrt::Transform,_std::hash<pbrt::Transform>_> *in_stack_ffffffffffffef20;
  ParameterDictionary *in_stack_ffffffffffffef28;
  undefined4 in_stack_ffffffffffffef30;
  undefined4 in_stack_ffffffffffffef34;
  string *in_stack_ffffffffffffef38;
  undefined4 in_stack_ffffffffffffef40;
  undefined4 in_stack_ffffffffffffef44;
  SceneEntity *in_stack_ffffffffffffef48;
  BasicScene *in_stack_ffffffffffffef50;
  char *in_stack_ffffffffffffef58;
  FileLoc *in_stack_ffffffffffffef60;
  RGBColorSpace *in_stack_ffffffffffffef68;
  ParsedParameterVector *in_stack_ffffffffffffef70;
  ParsedParameterVector *in_stack_ffffffffffffef78;
  ParameterDictionary *in_stack_ffffffffffffef80;
  undefined8 in_stack_ffffffffffffefa8;
  int index;
  BasicSceneBuilder *in_stack_ffffffffffffefb0;
  undefined1 in_stack_ffffffffffffefff;
  Transform *in_stack_fffffffffffff000;
  AnimatedTransform *in_stack_fffffffffffff008;
  ParameterDictionary *in_stack_fffffffffffff010;
  string *in_stack_fffffffffffff018;
  AnimatedShapeSceneEntity *in_stack_fffffffffffff020;
  BasicSceneBuilder *in_stack_fffffffffffff030;
  undefined1 in_stack_fffffffffffff038 [16];
  int in_stack_fffffffffffff048;
  string *in_stack_fffffffffffff050;
  int in_stack_fffffffffffff058;
  string *in_stack_fffffffffffff060;
  string *in_stack_fffffffffffff068;
  int local_108;
  
  index = (int)((ulong)in_stack_ffffffffffffefa8 >> 0x20);
  if (*(int *)(in_RDI + 0x18) != 0) {
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                     *)CONCAT44(in_stack_ffffffffffffef34,in_stack_ffffffffffffef30),
                    &in_stack_ffffffffffffef28->params);
    ParameterDictionary::ParameterDictionary
              (in_stack_ffffffffffffef80,in_stack_ffffffffffffef78,in_stack_ffffffffffffef70,
               in_stack_ffffffffffffef68);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                      *)in_stack_ffffffffffffef20);
    local_108 = -1;
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      index = (int)((ulong)*(undefined8 *)(in_RDI + 0x10) >> 0x20);
      in_stack_ffffffffffffefb0 = (BasicSceneBuilder *)(in_RDI + 0x88);
      ParameterDictionary::ParameterDictionary
                ((ParameterDictionary *)
                 CONCAT44(in_stack_ffffffffffffef34,in_stack_ffffffffffffef30),
                 in_stack_ffffffffffffef28);
      in_stack_ffffffffffffef18 = *(Transform **)(in_RDI + 0x118);
      in_stack_ffffffffffffef20 =
           *(InternCache<pbrt::Transform,_std::hash<pbrt::Transform>_> **)(in_RDI + 0x120);
      loc_00.filename._M_str = in_stack_ffffffffffffef58;
      loc_00.filename._M_len = (size_t)in_stack_ffffffffffffef50;
      loc_00._16_8_ = in_stack_ffffffffffffef60;
      SceneEntity::SceneEntity
                ((SceneEntity *)CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                 in_stack_ffffffffffffef38,
                 (ParameterDictionary *)
                 CONCAT44(in_stack_ffffffffffffef34,in_stack_ffffffffffffef30),loc_00);
      local_108 = BasicScene::AddAreaLight(in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
      SceneEntity::~SceneEntity((SceneEntity *)0x780736);
      ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x780743);
      if (*(long *)(in_RDI + 0x5f0) != 0) {
        Warning((FileLoc *)in_stack_ffffffffffffef20,(char *)in_stack_ffffffffffffef18);
      }
    }
    bVar1 = CTMIsAnimated((BasicSceneBuilder *)0x78080b);
    if (bVar1) {
      RenderFromObject(in_stack_fffffffffffff030);
      vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
      vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
      pbrt::Transform::Transform((Transform *)in_stack_ffffffffffffef20);
      InternCache<pbrt::Transform,_std::hash<pbrt::Transform>_>::Lookup
                (in_stack_ffffffffffffef20,in_stack_ffffffffffffef18);
      ParameterDictionary::ParameterDictionary
                ((ParameterDictionary *)in_stack_ffffffffffffef20,
                 (ParameterDictionary *)in_stack_ffffffffffffef18);
      shape = (AnimatedShapeSceneEntity *)(in_RDI + 0x68);
      loc_01.filename._M_str = (char *)in_stack_fffffffffffff038._0_8_;
      loc_01.line = in_stack_fffffffffffff038._8_4_;
      loc_01.column = in_stack_fffffffffffff038._12_4_;
      loc_01.filename._M_len = (size_t)in_stack_fffffffffffff030;
      AnimatedShapeSceneEntity::AnimatedShapeSceneEntity
                (in_stack_fffffffffffff020,in_stack_fffffffffffff018,in_stack_fffffffffffff010,
                 loc_01,in_stack_fffffffffffff008,in_stack_fffffffffffff000,
                 (bool)in_stack_ffffffffffffefff,in_stack_fffffffffffff048,in_stack_fffffffffffff050
                 ,in_stack_fffffffffffff058,in_stack_fffffffffffff060,in_stack_fffffffffffff068);
      ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x78097f);
      if (*(long *)(in_RDI + 0x5f0) == 0) {
        AnimatedShapeSceneEntity::AnimatedShapeSceneEntity(in_stack_00000010,in_stack_00000008);
        BasicScene::AddAnimatedShape
                  ((BasicScene *)CONCAT44(in_stack_ffffffffffffef44,local_108),shape);
        AnimatedShapeSceneEntity::~AnimatedShapeSceneEntity(in_stack_00000010);
      }
      else {
        std::vector<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
        ::push_back((vector<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
                     *)in_stack_00000010,in_stack_00000008);
      }
      AnimatedShapeSceneEntity::~AnimatedShapeSceneEntity(in_stack_00000010);
    }
    else {
      RenderFromObject(in_stack_ffffffffffffefb0,index);
      InternCache<pbrt::Transform,_std::hash<pbrt::Transform>_>::Lookup
                (in_stack_ffffffffffffef20,in_stack_ffffffffffffef18);
      Inverse((Transform *)CONCAT44(in_stack_ffffffffffffef34,in_stack_ffffffffffffef30));
      InternCache<pbrt::Transform,_std::hash<pbrt::Transform>_>::Lookup
                (in_stack_ffffffffffffef20,in_stack_ffffffffffffef18);
      ParameterDictionary::ParameterDictionary
                ((ParameterDictionary *)in_stack_ffffffffffffef20,
                 (ParameterDictionary *)in_stack_ffffffffffffef18);
      loc_02.filename._M_str = (char *)in_stack_fffffffffffff038._0_8_;
      loc_02.line = in_stack_fffffffffffff038._8_4_;
      loc_02.column = in_stack_fffffffffffff038._12_4_;
      loc_02.filename._M_len = (size_t)in_stack_fffffffffffff030;
      ShapeSceneEntity::ShapeSceneEntity
                ((ShapeSceneEntity *)in_stack_fffffffffffff020,in_stack_fffffffffffff018,
                 in_stack_fffffffffffff010,loc_02,&in_stack_fffffffffffff008->startTransform,
                 in_stack_fffffffffffff000,(bool)in_stack_ffffffffffffefff,in_stack_fffffffffffff048
                 ,in_stack_fffffffffffff050,in_stack_fffffffffffff058,in_stack_fffffffffffff060,
                 in_stack_fffffffffffff068);
      ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x780c07);
      if (*(long *)(in_RDI + 0x5f0) == 0) {
        std::vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>::push_back
                  ((vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *)
                   in_stack_00000010,(value_type *)in_stack_00000008);
      }
      else {
        std::vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>::push_back
                  ((vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *)
                   in_stack_00000010,(value_type *)in_stack_00000008);
      }
      ShapeSceneEntity::~ShapeSceneEntity((ShapeSceneEntity *)in_stack_00000010);
    }
    ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x780cbd);
    return;
  }
  ErrorExit<char_const(&)[6]>
            (in_stack_ffffffffffffef60,in_stack_ffffffffffffef58,
             (char (*) [6])in_stack_ffffffffffffef50);
}

Assistant:

void BasicSceneBuilder::Shape(const std::string &name, ParsedParameterVector params,
                              FileLoc loc) {
    VERIFY_WORLD("Shape");

    ParameterDictionary dict(std::move(params), graphicsState.shapeAttributes,
                             graphicsState.colorSpace);

    int areaLightIndex = -1;
    if (!graphicsState.areaLightName.empty()) {
        areaLightIndex = scene->AddAreaLight(SceneEntity(graphicsState.areaLightName,
                                                         graphicsState.areaLightParams,
                                                         graphicsState.areaLightLoc));
        if (activeInstanceDefinition)
            Warning(&loc, "Area lights not supported with object instancing");
    }

    if (CTMIsAnimated()) {
        AnimatedTransform renderFromShape = RenderFromObject();
        const class Transform *identity = transformCache.Lookup(pbrt::Transform());

        AnimatedShapeSceneEntity entity(
            {name, std::move(dict), loc, renderFromShape, identity,
             graphicsState.reverseOrientation, graphicsState.currentMaterialIndex,
             graphicsState.currentMaterialName, areaLightIndex,
             graphicsState.currentInsideMedium, graphicsState.currentOutsideMedium});

        if (activeInstanceDefinition)
            activeInstanceDefinition->entity.animatedShapes.push_back(std::move(entity));
        else
            scene->AddAnimatedShape(std::move(entity));
    } else {
        const class Transform *renderFromObject =
            transformCache.Lookup(RenderFromObject(0));
        const class Transform *objectFromRender =
            transformCache.Lookup(Inverse(*renderFromObject));

        ShapeSceneEntity entity(
            {name, std::move(dict), loc, renderFromObject, objectFromRender,
             graphicsState.reverseOrientation, graphicsState.currentMaterialIndex,
             graphicsState.currentMaterialName, areaLightIndex,
             graphicsState.currentInsideMedium, graphicsState.currentOutsideMedium});
        if (activeInstanceDefinition)
            activeInstanceDefinition->entity.shapes.push_back(std::move(entity));
        else
            shapes.push_back(std::move(entity));
    }
}